

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

TValue * luaH_newkey(lua_State *L,Table *t,TValue *key)

{
  int *piVar1;
  int iVar2;
  Node *pNVar3;
  uint uVar4;
  Value VVar5;
  undefined8 uVar6;
  uint uVar7;
  undefined4 uVar8;
  int iVar9;
  Node *pNVar10;
  Node *pNVar11;
  Node *pNVar12;
  TValue *pTVar13;
  long lVar14;
  int lg;
  Node *pNVar15;
  uint uVar16;
  ulong uVar17;
  uint ause;
  int iVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  char *fmt;
  int iVar23;
  uint uVar24;
  int iVar25;
  TValue *io_;
  lua_Integer k;
  TValue aux;
  Value local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Value local_40;
  undefined4 local_38;
  
  if (key->tt_ == 3) {
    iVar18 = luaV_tointeger(key,&local_c8.i,0);
    if (iVar18 == 0) {
      if (NAN((key->value_).n)) {
        fmt = "table index is NaN";
        goto LAB_001209b9;
      }
    }
    else {
      key = (TValue *)&local_40;
      local_40 = local_c8;
      local_38 = 0x13;
    }
  }
  else if (key->tt_ == 0) {
    fmt = "table index is nil";
LAB_001209b9:
    luaG_runerror(L,fmt);
  }
  pNVar10 = mainposition(t,key);
  pNVar3 = t->lastfree;
  if ((pNVar10->i_val).tt_ == 0) {
    if (pNVar3 == (Node *)0x0) goto LAB_001207c8;
  }
  else {
    if (pNVar3 == (Node *)0x0) {
LAB_001207c8:
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8.gc = (GCObject *)0x0;
      uStack_c0 = 0;
      uVar22 = t->sizearray;
      lVar20 = 0;
      uVar16 = 1;
      iVar18 = 0;
      uVar21 = 1;
      do {
        uVar24 = uVar21;
        if ((uVar22 < uVar21) && (uVar24 = uVar22, uVar22 < uVar16)) break;
        iVar23 = 0;
        if (uVar16 <= uVar24) {
          uVar16 = uVar16 - 1;
          iVar23 = 0;
          do {
            iVar23 = (iVar23 + 1) - (uint)(t->array[uVar16].tt_ == 0);
            uVar16 = uVar16 + 1;
          } while (uVar24 != uVar16);
          uVar16 = uVar24 + 1;
        }
        piVar1 = (int *)((long)&local_c8 + lVar20 * 4);
        *piVar1 = *piVar1 + iVar23;
        iVar18 = iVar18 + iVar23;
        lVar20 = lVar20 + 1;
        uVar21 = uVar21 * 2;
      } while (lVar20 != 0x20);
      uVar17 = (ulong)(uint)~(-1 << (t->lsizenode & 0x1f)) << 5 | 0x10;
      iVar23 = 0;
      iVar25 = 0;
      do {
        if (*(int *)((long)t->node + (uVar17 - 8)) != 0) {
          iVar9 = countint((TValue *)((long)&(t->node->i_val).value_ + uVar17),(uint *)&local_c8.b);
          iVar25 = iVar25 + iVar9;
          iVar23 = iVar23 + 1;
        }
        uVar17 = uVar17 - 0x20;
      } while (uVar17 != 0xfffffffffffffff0);
      iVar9 = countint(key,(uint *)&local_c8.b);
      uVar22 = 1;
      lVar20 = 0;
      uVar16 = 0;
      uVar21 = 0;
      uVar24 = 0;
      do {
        if ((uint)(iVar9 + iVar25 + iVar18) <= uVar22 >> 1) break;
        iVar2 = *(int *)((long)&local_c8 + lVar20 * 4);
        uVar24 = uVar24 + iVar2;
        uVar4 = uVar16;
        uVar7 = uVar21;
        if (uVar22 >> 1 < uVar24) {
          uVar4 = uVar22;
          uVar7 = uVar24;
        }
        if (iVar2 != 0) {
          uVar16 = uVar4;
          uVar21 = uVar7;
        }
        lVar20 = lVar20 + 1;
        uVar22 = uVar22 * 2;
      } while (lVar20 != 0x20);
      luaH_resize(L,t,uVar16,((iVar18 + iVar23) - uVar21) + 1);
      pTVar13 = luaH_set(L,t,key);
      return pTVar13;
    }
    lVar20 = 0;
    do {
      lVar19 = lVar20;
      if ((Node *)((long)&(pNVar3->i_val).value_ + lVar19) <= t->node) goto LAB_001207c8;
      pNVar11 = (Node *)((long)&pNVar3[-1].i_val.value_ + lVar19);
      t->lastfree = pNVar11;
      lVar20 = lVar19 + -0x20;
    } while ((pNVar11->i_key).nk.tt_ != 0);
    pNVar11 = mainposition(t,&(pNVar10->i_key).tvk);
    pNVar15 = (Node *)((long)&pNVar3[-1].i_val.value_ + lVar19);
    if (pNVar11 == pNVar10) {
      lVar14 = (long)(pNVar10->i_key).nk.next;
      if (lVar14 != 0) {
        *(int *)((long)&pNVar3[-1].i_key + lVar19 + 0xc) =
             (int)((ulong)((long)pNVar10 + ((lVar14 * 0x20 - (long)pNVar3) - lVar20)) >> 5);
      }
      (pNVar10->i_key).nk.next = (int)((ulong)((long)pNVar3 + (lVar20 - (long)pNVar10)) >> 5);
      pNVar10 = pNVar15;
    }
    else {
      do {
        pNVar12 = pNVar11;
        pNVar11 = pNVar12 + (pNVar12->i_key).nk.next;
      } while (pNVar12 + (pNVar12->i_key).nk.next != pNVar10);
      (pNVar12->i_key).nk.next = (int)((ulong)((long)pNVar3 + (lVar20 - (long)pNVar12)) >> 5);
      VVar5 = (pNVar10->i_val).value_;
      iVar18 = (pNVar10->i_val).tt_;
      uVar8 = *(undefined4 *)&(pNVar10->i_val).field_0xc;
      uVar6 = *(undefined8 *)((long)&pNVar10->i_key + 8);
      (pNVar15->i_key).nk.value_ = (pNVar10->i_key).nk.value_;
      *(undefined8 *)((long)&pNVar15->i_key + 8) = uVar6;
      (pNVar15->i_val).value_ = VVar5;
      (pNVar15->i_val).tt_ = iVar18;
      *(undefined4 *)&(pNVar15->i_val).field_0xc = uVar8;
      if ((pNVar10->i_key).nk.next != 0) {
        piVar1 = (int *)((long)&pNVar3[-1].i_key + lVar19 + 0xc);
        *piVar1 = *piVar1 + (int)((ulong)((long)pNVar10 + (-lVar20 - (long)pNVar3)) >> 5);
        (pNVar10->i_key).nk.next = 0;
      }
      (pNVar10->i_val).tt_ = 0;
    }
  }
  (pNVar10->i_key).nk.value_ = key->value_;
  uVar22 = ((Value *)((long)key + 8))->b;
  (pNVar10->i_key).nk.tt_ = uVar22;
  if ((((uVar22 & 0x40) != 0) && ((t->marked & 4) != 0)) && (((*(GCObject **)key)->marked & 3) != 0)
     ) {
    luaC_barrierback_(L,t);
  }
  return &pNVar10->i_val;
}

Assistant:

TValue *luaH_newkey (lua_State *L, Table *t, const TValue *key) {
  Node *mp;
  TValue aux;
  if (ttisnil(key)) luaG_runerror(L, "table index is nil");
  else if (ttisfloat(key)) {
    lua_Integer k;
    if (luaV_tointeger(key, &k, 0)) {  /* does index fit in an integer? */
      setivalue(&aux, k);
      key = &aux;  /* insert it as an integer */
    }
    else if (luai_numisnan(fltvalue(key)))
      luaG_runerror(L, "table index is NaN");
  }
  mp = mainposition(t, key);
  if (!ttisnil(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' takes care of TM cache */
      return luaH_set(L, t, key);  /* insert key into grown table */
    }
    lua_assert(!isdummy(t));
    othern = mainposition(t, gkey(mp));
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setnilvalue(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(L, &mp->i_key, key);
  luaC_barrierback(L, t, key);
  lua_assert(ttisnil(gval(mp)));
  return gval(mp);
}